

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O0

bool __thiscall ON_MeshNGonEdge::SetEdgePtr(ON_MeshNGonEdge *this,ON_SubDEdgePtr eptr)

{
  bool bVar1;
  uchar uVar2;
  ON_MeshNGonEdge *this_local;
  ON_SubDEdgePtr eptr_local;
  
  this_local = (ON_MeshNGonEdge *)eptr.m_ptr;
  if (this->m_u_status == '\x01') {
    bVar1 = ON_SubDEdgePtr::IsNull((ON_SubDEdgePtr *)&this_local);
    uVar2 = '\x02';
    if (bVar1) {
      uVar2 = '\0';
    }
    this->m_u_status = uVar2;
    this->m_u = (anon_union_8_2_07f07f9a_for_m_u)this_local;
    eptr_local.m_ptr._7_1_ = true;
  }
  else {
    ON_SubDIncrementErrorCount();
    eptr_local.m_ptr._7_1_ = false;
  }
  return eptr_local.m_ptr._7_1_;
}

Assistant:

bool SetEdgePtr(ON_SubDEdgePtr eptr)
  {
    if (1 == m_u_status)
    {
      m_u_status = eptr.IsNull() ? 0 : 2;
      m_u.subd_edgeptr = eptr;
      return true;
    }
    return ON_SUBD_RETURN_ERROR(false);
  }